

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  double *__ptr;
  DenseIndex DVar2;
  DenseIndex DVar3;
  double *__tmp;
  ostream *poVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  double *pdVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  CoeffReturnType pdVar8;
  VectorXd *pVVar9;
  float fVar10;
  float fVar11;
  Scalar local_130;
  Scalar local_128;
  double local_120;
  Scalar local_118;
  VectorXd *local_110;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_108;
  double local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_50;
  
  if (this->is_initialized_ != false) {
    fVar10 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0)
    ;
    this->previous_timestamp_ = measurement_pack->timestamp_;
    local_110._0_4_ = fVar10;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar10);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_108.m_xpr = &(this->ekf_).F_;
    local_108.m_row = 0;
    local_108.m_col = 1;
    local_108.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_128 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_108,&local_128);
    local_130 = (Scalar)local_110._0_4_;
    local_120 = local_130;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_130);
    local_118 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_118);
    local_c8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_c8);
    local_d0 = 1.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_d0);
    local_d8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_d8);
    local_e0 = local_120;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_e0);
    local_a8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_a8);
    local_b0 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_b0);
    local_b8 = 1.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_b8);
    local_c0 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_c0);
    local_88 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_88);
    local_90 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_90);
    local_98 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_98);
    local_a0 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_a0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_108);
    local_e8 = pow(local_120,3.0);
    local_120 = pow(local_120,4.0);
    local_128 = (Scalar)CONCAT44(local_128._4_4_,4);
    local_130 = (Scalar)CONCAT44(local_130._4_4_,4);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_108,(int *)&local_128,(int *)&local_130);
    pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_108.m_xpr;
    DVar2 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar3 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_108.m_row;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_108.m_col;
    local_108.m_xpr = pMVar1;
    local_108.m_row = DVar2;
    local_108.m_col = DVar3;
    local_120._0_4_ = (float)local_120;
    free(pMVar1);
    local_120._0_4_ = local_120._0_4_ * 0.25;
    local_108.m_row = 0;
    local_108.m_col = 1;
    local_108.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->sigma_ax * local_120._0_4_);
    local_128 = 0.0;
    local_108.m_xpr = &(this->ekf_).Q_;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_108,&local_128);
    fVar10 = (float)local_e8;
    local_e8 = (double)CONCAT44(local_e8._4_4_,fVar10 * 0.5);
    local_130 = (Scalar)(this->sigma_ax * fVar10 * 0.5);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_130);
    local_118 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_118);
    local_c8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_c8);
    local_d0 = (Scalar)(local_120._0_4_ * this->sigma_ay);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_d0);
    local_d8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_d8);
    local_e0 = (Scalar)(this->sigma_ay * local_e8._0_4_);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_e0);
    local_a8 = (Scalar)(this->sigma_ax * local_e8._0_4_);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_a8);
    local_b0 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_b0);
    local_110._0_4_ = local_110._0_4_ * local_110._0_4_;
    local_b8 = (Scalar)(this->sigma_ax * local_110._0_4_);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_b8);
    local_c0 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_c0);
    local_88 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_88);
    local_90 = (Scalar)(local_e8._0_4_ * this->sigma_ay);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_90);
    local_98 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_98);
    local_a0 = (Scalar)(local_110._0_4_ * this->sigma_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_a0);
    this_00 = &this->ekf_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_108);
    KalmanFilter::Predict(this_00);
    if (measurement_pack->sensor_type_ == RADAR) {
      Tools::CalculateJacobian((MatrixXd *)&local_108,&this->tools,&(this->ekf_).x_);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_50,&this->Hj_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_108);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_50);
      free(local_108.m_xpr);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Hj_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
      KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
    }
    else {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
      KalmanFilter::Update(this_00,&measurement_pack->raw_measurements_);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &(this->ekf_).x_);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &(this->ekf_).P_);
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"EKF: ");
  std::endl<char,std::char_traits<char>>(poVar4);
  pdVar6 = (double *)Eigen::internal::aligned_malloc(0x20);
  pVVar9 = &(this->ekf_).x_;
  __ptr = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       pdVar6;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       4;
  free(__ptr);
  local_108.m_row = 0;
  local_108.m_col = 1;
  local_108.m_currentBlockRows = 1;
  *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       1.0;
  local_128 = 1.0;
  local_108.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar9;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,
                      &local_128);
  local_130 = 1.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_130);
  local_118 = 1.0;
  local_110 = pVVar9;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_118);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108);
  local_128 = (Scalar)CONCAT44(local_128._4_4_,4);
  local_130 = (Scalar)CONCAT44(local_130._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_108,(int *)&local_128,(int *)&local_130);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_108.m_xpr;
  DVar2 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar3 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_108.m_row;
  (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_108.m_col;
  local_108.m_xpr = pMVar1;
  local_108.m_row = DVar2;
  local_108.m_col = DVar3;
  free(pMVar1);
  local_108.m_row = 0;
  local_108.m_col = 1;
  local_108.m_currentBlockRows = 1;
  *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = 1.0;
  local_128 = 0.0;
  local_108.m_xpr = &(this->ekf_).F_;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_108,&local_128);
  local_130 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_130);
  local_118 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_118);
  local_c8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c8);
  local_d0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d0);
  local_d8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d8);
  local_e0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_e0);
  local_a8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_a8);
  local_b0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b0);
  local_b8 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b8);
  local_c0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c0);
  local_88 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_88);
  local_90 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_90);
  local_98 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_98);
  local_a0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_108);
  local_128 = (Scalar)CONCAT44(local_128._4_4_,4);
  local_130 = (Scalar)CONCAT44(local_130._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_108,(int *)&local_128,(int *)&local_130);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_108.m_xpr;
  DVar2 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar3 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_108.m_row;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_108.m_col;
  local_108.m_xpr = pMVar1;
  local_108.m_row = DVar2;
  local_108.m_col = DVar3;
  free(pMVar1);
  local_108.m_row = 0;
  local_108.m_col = 1;
  local_108.m_currentBlockRows = 1;
  *(this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = 1.0;
  local_128 = 0.0;
  local_108.m_xpr = &(this->ekf_).P_;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_108,&local_128);
  local_130 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_130);
  local_118 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_118);
  local_c8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c8);
  local_d0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d0);
  local_d8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d8);
  local_e0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_e0);
  local_a8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_a8);
  local_b0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b0);
  local_b8 = 1000.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b8);
  local_c0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c0);
  local_88 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_88);
  local_90 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_90);
  local_98 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_98);
  local_a0 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_108);
  local_108.m_xpr = &this->H_laser_;
  local_108.m_row = 0;
  local_108.m_col = 1;
  local_108.m_currentBlockRows = 1;
  *(this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
   m_data = 1.0;
  local_128 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_108,&local_128);
  local_130 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_130);
  local_118 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_118);
  local_c8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c8);
  local_d0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d0);
  local_d8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d8);
  local_e0 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_108);
  local_108.m_xpr = &this->Hj_;
  local_108.m_row = 0;
  local_108.m_col = 1;
  local_108.m_currentBlockRows = 1;
  *(this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       1.0;
  local_128 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_108,&local_128);
  local_130 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_130);
  local_118 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_118);
  local_c8 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_c8);
  local_d0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d0);
  local_d8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_d8);
  local_e0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_e0);
  local_a8 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_a8);
  local_b0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b0);
  local_b8 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_b8);
  local_c0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_c0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_108);
  this->sigma_ax = 9.0;
  this->sigma_ay = 9.0;
  this->previous_timestamp_ = measurement_pack->timestamp_;
  if (measurement_pack->sensor_type_ == LASER) {
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,0);
    this->px = (float)*pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,1);
    fVar11 = (float)*pdVar8;
    this->py = fVar11;
    fVar10 = this->px;
    if ((fVar10 == 0.0) && (!NAN(fVar10))) {
      return;
    }
    if ((fVar11 == 0.0) && (!NAN(fVar11))) {
      return;
    }
    local_108.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)local_110;
    local_108.m_row = 0;
    local_108.m_col = 1;
    local_108.m_currentBlockRows = 1;
    *(local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double)fVar10;
    local_128 = (Scalar)fVar11;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,
                        &local_128);
    local_130 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar7,&local_130);
    local_118 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_118);
  }
  else {
    if (measurement_pack->sensor_type_ != RADAR) goto LAB_001036df;
    pVVar9 = &measurement_pack->raw_measurements_;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,0);
    local_120 = *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,1);
    local_e8 = cos(*pdVar8);
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,0);
    local_58 = *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,1);
    local_60 = sin(*pdVar8);
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,2);
    local_68 = *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,1);
    local_70 = cos(*pdVar8);
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,2);
    local_78 = *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,1);
    local_80 = sin(*pdVar8);
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,0);
    if ((*pdVar8 == 0.0) && (!NAN(*pdVar8))) {
LAB_00103487:
      local_108.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)local_110;
      local_108.m_row = 0;
      local_108.m_col = 1;
      local_108.m_currentBlockRows = 1;
      *(local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           = 0.0;
      local_128 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,
                          &local_128);
      local_130 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar7,&local_130);
      local_118 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_118)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108);
      return;
    }
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pVVar9,1);
    if ((*pdVar8 == 0.0) && (!NAN(*pdVar8))) goto LAB_00103487;
    local_108.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)local_110;
    local_108.m_row = 0;
    local_108.m_col = 1;
    local_108.m_currentBlockRows = 1;
    *(local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double)(float)(local_120 * local_e8);
    local_128 = (Scalar)(float)(local_58 * local_60);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,
                        &local_128);
    local_130 = (Scalar)(float)(local_68 * local_70);
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar7,&local_130);
    local_118 = (Scalar)(float)(local_78 * local_80);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_118);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108);
LAB_001036df:
  this->is_initialized_ = true;
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {
    /**
    TODO:
      * Initialize the state ekf_.x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
    */
    // first measurement
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // initial transition matrix F_
    ekf_.F_ = MatrixXd(4,4);
    ekf_.F_ << 1,0,1,0,
               0,1,0,1,
               0,0,1,0,
               0,0,0,1;

    // initial state covariance matrix P (error in the estimate/prediction)
    ekf_.P_ = MatrixXd (4,4);
    ekf_.P_ << 1,0,0,0,
               0,1,0,0,
               0,0,1000,0,
               0,0,0,1000;

      
    // Laser measurement matrix
    H_laser_ << 1,0,0,0,
                0,1,0,0;

    // Radar measurement matrix
    Hj_ << 1,1,0,0,
           1,1,0,0,
           1,1,1,1;

    // Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix 
    sigma_ax = 9;
    sigma_ay = 9;

    // initial timestamp 
    previous_timestamp_ = measurement_pack.timestamp_;

  

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
      Convert radar from polar to cartesian coordinates and initialize state.
      */
      float px = measurement_pack.raw_measurements_[0]*cos(measurement_pack.raw_measurements_[1]);
      //px = rho * cos(phi)
      float py = measurement_pack.raw_measurements_[0]*sin(measurement_pack.raw_measurements_[1]);
      //py = rho * sin(phi)
      float vx = measurement_pack.raw_measurements_[2]*cos(measurement_pack.raw_measurements_[1]);
      //vx = rho_dot * cos(phi)
      float vy = measurement_pack.raw_measurements_[2]*sin(measurement_pack.raw_measurements_[1]);
      //vy = rho_dot * sin(phi)


      if (measurement_pack.raw_measurements_[0] == 0 or measurement_pack.raw_measurements_[1] == 0){
        ekf_.x_<< 0, 0, 0, 0;
        return;
      }
      
      ekf_.x_ <<px, py, vx, vy;
       
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.
      */
      px = measurement_pack.raw_measurements_[0];
      py = measurement_pack.raw_measurements_[1];

      if (px == 0 or py == 0){
        return;
      }
      ekf_.x_<<px, py, 0, 0;
    }

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  /**
   TODO:
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix.
   */
  //dt - convert delta time to seconds
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0; 
  previous_timestamp_ = measurement_pack.timestamp_;
  cout << dt << endl;
  
  //update the transision Matrix F
  ekf_.F_ << 1, 0, dt, 0,
             0, 1, 0, dt,
             0, 0, 1, 0,
             0, 0, 0, 1;

  float dt_2 = pow(dt, 2);
  float dt_3 = pow(dt, 3);
  float dt_4 = pow(dt, 4);
  
  //set the process noise covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (dt_4/4)*sigma_ax, 0, (dt_3/2)*sigma_ax, 0,
              0, (dt_4/4)*sigma_ay, 0, (dt_3/2)*sigma_ay,
              (dt_3/2)*sigma_ax, 0, dt_2*sigma_ax, 0,
              0, (dt_3/2)*sigma_ay, 0, dt_2*sigma_ay;


  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
   TODO:
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates
    Hj_ << tools.CalculateJacobian(ekf_.x_);
    ekf_.H_ = Hj_;
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);  
  } 
  else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}